

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall cmFileAPI::BuildReply(Value *__return_storage_ptr__,cmFileAPI *this,Query *q)

{
  bool bVar1;
  Value *pVVar2;
  Object *o_00;
  allocator<char> local_111;
  string local_110;
  Value local_f0;
  reference local_c8;
  string *name_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string local_70;
  string *local_50;
  string *name;
  Object *o;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_> *__range1;
  Query *q_local;
  cmFileAPI *this_local;
  Value *reply;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  __end1 = std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::begin(&q->Known);
  o = (Object *)std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::end(&q->Known);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmFileAPI::Object_*,_std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>_>
                                     *)&o), bVar1) {
    name = (string *)
           __gnu_cxx::
           __normal_iterator<const_cmFileAPI::Object_*,_std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>_>
           ::operator*(&__end1);
    ObjectName_abi_cxx11_(&local_70,(cmFileAPI *)name,o_00);
    local_50 = &local_70;
    pVVar2 = AddReplyIndexObject(this,(Object *)name);
    Json::Value::Value((Value *)&__range1_1,pVVar2);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,local_50);
    Json::Value::operator=(pVVar2,(Value *)&__range1_1);
    Json::Value::~Value((Value *)&__range1_1);
    std::__cxx11::string::~string((string *)&local_70);
    __gnu_cxx::
    __normal_iterator<const_cmFileAPI::Object_*,_std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&q->Unknown);
  name_1 = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&q->Unknown);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&name_1), bVar1) {
    local_c8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"unknown query file",&local_111);
    BuildReplyError(&local_f0,&local_110);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,local_c8);
    Json::Value::operator=(pVVar2,&local_f0);
    Json::Value::~Value(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReply(Query const& q)
{
  Json::Value reply = Json::objectValue;
  for (Object const& o : q.Known) {
    std::string const& name = ObjectName(o);
    reply[name] = this->AddReplyIndexObject(o);
  }

  for (std::string const& name : q.Unknown) {
    reply[name] = cmFileAPI::BuildReplyError("unknown query file");
  }
  return reply;
}